

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  uint32 uVar4;
  int iVar5;
  Descriptor *pDVar6;
  OneofDescriptor *pOVar7;
  int64 iVar8;
  long *plVar9;
  uint *puVar10;
  uint64 uVar11;
  unsigned_long *puVar12;
  float *pfVar13;
  double *pdVar14;
  bool *pbVar15;
  EnumValueDescriptor *this_00;
  int *piVar16;
  InlinedStringField *pIVar17;
  ArenaStringPtr *this_01;
  string *this_02;
  string *default_value;
  Arena *pAVar18;
  Message **ppMVar19;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<unsigned_long> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<bool> *this_08;
  RepeatedField<int> *pRVar20;
  MapFieldBase *pMVar21;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  long *in_RDI;
  float fVar22;
  double dVar23;
  FieldDescriptor *in_stack_00000010;
  Message *in_stack_00000018;
  Reflection *in_stack_00000020;
  string *default_ptr;
  string *default_ptr_1;
  Arena *in_stack_ffffffffffffff48;
  Reflection *in_stack_ffffffffffffff50;
  Message *in_stack_ffffffffffffff58;
  Reflection *in_stack_ffffffffffffff60;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffe0;
  FieldDescriptor *in_stack_ffffffffffffffe8;
  Descriptor *in_stack_fffffffffffffff0;
  
  plVar9 = in_RDI;
  pDVar6 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar6 != (Descriptor *)*in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               (char *)plVar9);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
    iVar5 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    FieldDescriptor::number(in_RDX);
    internal::ExtensionSet::ClearExtension((ExtensionSet *)in_stack_ffffffffffffff50,iVar5);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x423d7b);
    if (bVar1) {
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4241d5);
      switch(CVar2) {
      case CPPTYPE_INT32:
        pRVar20 = MutableRaw<google::protobuf::RepeatedField<int>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<int>::Clear(pRVar20);
        break;
      case CPPTYPE_INT64:
        this_03 = MutableRaw<google::protobuf::RepeatedField<long>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<long>::Clear(this_03);
        break;
      case CPPTYPE_UINT32:
        this_04 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<unsigned_int>::Clear(this_04);
        break;
      case CPPTYPE_UINT64:
        this_05 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<unsigned_long>::Clear(this_05);
        break;
      case CPPTYPE_DOUBLE:
        this_06 = MutableRaw<google::protobuf::RepeatedField<double>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<double>::Clear(this_06);
        break;
      case CPPTYPE_FLOAT:
        this_07 = MutableRaw<google::protobuf::RepeatedField<float>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<float>::Clear(this_07);
        break;
      case CPPTYPE_BOOL:
        this_08 = MutableRaw<google::protobuf::RepeatedField<bool>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<bool>::Clear(this_08);
        break;
      case CPPTYPE_ENUM:
        pRVar20 = MutableRaw<google::protobuf::RepeatedField<int>>
                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedField<int>::Clear(pRVar20);
        break;
      case CPPTYPE_STRING:
        FieldDescriptor::options(in_RDX);
        FieldOptions::ctype((FieldOptions *)0x424347);
        MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (FieldDescriptor *)in_stack_ffffffffffffff50);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x424371);
        break;
      case CPPTYPE_MESSAGE:
        bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x424380);
        if (bVar1) {
          pMVar21 = MutableRaw<google::protobuf::internal::MapFieldBase>
                              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                               (FieldDescriptor *)in_stack_ffffffffffffff50);
          (*pMVar21->_vptr_MapFieldBase[0xb])();
        }
        else {
          MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (FieldDescriptor *)in_stack_ffffffffffffff50);
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    (in_stack_ffffffffffffffc0);
        }
      }
    }
    else {
      pOVar7 = FieldDescriptor::containing_oneof(in_RDX);
      if (pOVar7 == (OneofDescriptor *)0x0) {
        bVar1 = HasBit(in_stack_00000020,in_stack_00000018,in_stack_00000010);
        if (bVar1) {
          ClearBit(in_RSI,(Message *)in_RDX,(FieldDescriptor *)in_stack_ffffffffffffffc0);
          CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x423dff);
          switch(CVar2) {
          case CPPTYPE_INT32:
            iVar3 = FieldDescriptor::default_value_int32(in_RDX);
            piVar16 = MutableRaw<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (FieldDescriptor *)in_stack_ffffffffffffff50);
            *piVar16 = iVar3;
            break;
          case CPPTYPE_INT64:
            iVar8 = FieldDescriptor::default_value_int64(in_RDX);
            plVar9 = MutableRaw<long>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (FieldDescriptor *)in_stack_ffffffffffffff50);
            *plVar9 = iVar8;
            break;
          case CPPTYPE_UINT32:
            uVar4 = FieldDescriptor::default_value_uint32(in_RDX);
            puVar10 = MutableRaw<unsigned_int>
                                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                 (FieldDescriptor *)in_stack_ffffffffffffff50);
            *puVar10 = uVar4;
            break;
          case CPPTYPE_UINT64:
            uVar11 = FieldDescriptor::default_value_uint64(in_RDX);
            puVar12 = MutableRaw<unsigned_long>
                                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                 (FieldDescriptor *)in_stack_ffffffffffffff50);
            *puVar12 = uVar11;
            break;
          case CPPTYPE_DOUBLE:
            dVar23 = FieldDescriptor::default_value_double(in_RDX);
            pdVar14 = MutableRaw<double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                         (FieldDescriptor *)in_stack_ffffffffffffff50);
            *pdVar14 = dVar23;
            break;
          case CPPTYPE_FLOAT:
            fVar22 = FieldDescriptor::default_value_float(in_RDX);
            pfVar13 = MutableRaw<float>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                        (FieldDescriptor *)in_stack_ffffffffffffff50);
            *pfVar13 = fVar22;
            break;
          case CPPTYPE_BOOL:
            bVar1 = FieldDescriptor::default_value_bool(in_RDX);
            pbVar15 = MutableRaw<bool>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                       (FieldDescriptor *)in_stack_ffffffffffffff50);
            *pbVar15 = bVar1;
            break;
          case CPPTYPE_ENUM:
            this_00 = FieldDescriptor::default_value_enum
                                ((FieldDescriptor *)in_stack_ffffffffffffff50);
            iVar5 = EnumValueDescriptor::number(this_00);
            piVar16 = MutableRaw<int>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (FieldDescriptor *)in_stack_ffffffffffffff50);
            *piVar16 = iVar5;
            break;
          case CPPTYPE_STRING:
            FieldDescriptor::options(in_RDX);
            FieldOptions::ctype((FieldOptions *)0x424008);
            bVar1 = IsInlined(in_stack_ffffffffffffff50,(FieldDescriptor *)in_stack_ffffffffffffff48
                             );
            if (bVar1) {
              DefaultRaw<google::protobuf::internal::InlinedStringField>
                        (in_stack_ffffffffffffff50,(FieldDescriptor *)in_stack_ffffffffffffff48);
              pIVar17 = MutableRaw<google::protobuf::internal::InlinedStringField>
                                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                   (FieldDescriptor *)in_stack_ffffffffffffff50);
              std::__cxx11::string::assign((string *)pIVar17);
            }
            else {
              this_01 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>
                                  (in_stack_ffffffffffffff50,
                                   (FieldDescriptor *)in_stack_ffffffffffffff48);
              this_02 = internal::ArenaStringPtr::Get_abi_cxx11_(this_01);
              default_value =
                   (string *)
                   MutableRaw<google::protobuf::internal::ArenaStringPtr>
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              (FieldDescriptor *)in_stack_ffffffffffffff50);
              GetArena(in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
              internal::ArenaStringPtr::SetAllocated
                        ((ArenaStringPtr *)this_02,default_value,(string *)in_stack_ffffffffffffff50
                         ,in_stack_ffffffffffffff48);
            }
            break;
          case CPPTYPE_MESSAGE:
            bVar1 = internal::ReflectionSchema::HasHasbits((ReflectionSchema *)(in_RDI + 1));
            if (bVar1) {
              ppMVar19 = MutableRaw<google::protobuf::Message*>
                                   (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                    (FieldDescriptor *)in_stack_ffffffffffffff50);
              (*((*ppMVar19)->super_MessageLite)._vptr_MessageLite[7])();
            }
            else {
              pAVar18 = GetArena(in_stack_ffffffffffffff50,(Message *)in_stack_ffffffffffffff48);
              if (pAVar18 == (Arena *)0x0) {
                ppMVar19 = MutableRaw<google::protobuf::Message*>
                                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                      (FieldDescriptor *)in_stack_ffffffffffffff50);
                in_stack_ffffffffffffff50 = (Reflection *)*ppMVar19;
                if (in_stack_ffffffffffffff50 != (Reflection *)0x0) {
                  (*((MessageLite *)&in_stack_ffffffffffffff50->descriptor_)->_vptr_MessageLite[1])
                            ();
                }
              }
              ppMVar19 = MutableRaw<google::protobuf::Message*>
                                   (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                    (FieldDescriptor *)in_stack_ffffffffffffff50);
              *ppMVar19 = (Message *)0x0;
            }
          }
        }
      }
      else {
        ClearOneofField(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        (FieldDescriptor *)in_stack_ffffffffffffff50);
      }
    }
  }
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32);
        CLEAR_TYPE(INT64, int64);
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* default_ptr =
                    &DefaultRaw<InlinedStringField>(field).GetNoArena();
                MutableRaw<InlinedStringField>(message, field)
                    ->SetNoArena(default_ptr, *default_ptr);
                break;
              }

              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)
                  ->SetAllocated(default_ptr, nullptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to nullptr in order to indicate its un-presence.
            if (GetArena(message) == nullptr) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = nullptr;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}